

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

void __thiscall
dxil_spv::Converter::Impl::fixup_load_type_atomic
          (Impl *this,ComponentType component_type,uint components,Value *value)

{
  Id IVar1;
  int iVar2;
  undefined7 in_register_00000031;
  ComponentType output_type;
  
  iVar2 = (int)CONCAT71(in_register_00000031,component_type);
  if (iVar2 == 2) {
    output_type = U16;
  }
  else if (iVar2 == 6) {
    output_type = U64;
  }
  else {
    if (iVar2 != 4) {
      return;
    }
    output_type = U32;
  }
  if (output_type == component_type) {
    return;
  }
  IVar1 = get_id_for_value(this,value,0);
  IVar1 = build_value_cast(this,IVar1,component_type,output_type,components);
  rewrite_value(this,value,IVar1);
  return;
}

Assistant:

void Converter::Impl::fixup_load_type_atomic(DXIL::ComponentType component_type, unsigned components, const llvm::Value *value)
{
	auto output_component_type = component_type;
	auto input_component_type = component_type;

	output_component_type = convert_component_to_unsigned(output_component_type);

	if (output_component_type != input_component_type)
	{
		rewrite_value(value, build_value_cast(get_id_for_value(value), input_component_type,
		                                      output_component_type, components));
	}
}